

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_composite_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t type;
  uint32_t value;
  CompilerError *pCVar4;
  size_t sVar5;
  bool *pbVar6;
  Bitset *pBVar7;
  SPIREntryPoint *pSVar8;
  size_type sVar9;
  TypedID<(spirv_cross::Types)1> *pTVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  SPIRType *pSVar13;
  bool local_3a1;
  SPIRType *local_390;
  anon_class_144_10_b368273c local_380;
  function<void_()> local_2f0;
  anon_class_88_7_b6b0666e local_2d0;
  function<void_()> local_278;
  uint32_t local_254;
  uint32_t local_250;
  uint32_t local_24c;
  uint32_t local_248;
  uint32_t local_244;
  uint32_t local_240;
  uint32_t local_23c;
  uint32_t local_238;
  uint32_t local_234;
  uint32_t index;
  uint32_t local_22c;
  uint32_t local_228;
  uint local_224;
  uint32_t local_220;
  uint local_21c;
  uint32_t locn_3;
  uint local_214;
  uint32_t local_210;
  uint local_20c;
  uint32_t locn_2;
  uint32_t local_204;
  TypedID<(spirv_cross::Types)1> local_200;
  TypedID<(spirv_cross::Types)1> local_1fc;
  uint32_t local_1f8;
  uint32_t local_1f4;
  TypedID<(spirv_cross::Types)1> local_1f0;
  uint32_t mbr_type_id;
  uint32_t local_1e8;
  uint32_t local_1e4;
  uint32_t comp;
  uint32_t local_1dc;
  uint32_t locn_1;
  allocator local_1d1;
  string local_1d0;
  string local_1b0;
  string local_190;
  undefined1 local_170 [8];
  string mbr_name;
  TypedID<(spirv_cross::Types)1> local_148;
  uint32_t local_144;
  uint32_t local_140;
  uint32_t local_13c;
  uint32_t local_138;
  uint32_t locn;
  byte local_12d;
  uint32_t type_id;
  uint32_t uStack_128;
  bool padded_output;
  uint32_t target_components;
  uint32_t ib_mbr_idx;
  uint32_t i;
  undefined4 local_118;
  uint32_t local_114;
  string local_110 [36];
  uint32_t local_ec;
  TypedID<(spirv_cross::Types)1> local_e8;
  uint32_t local_e4;
  undefined1 local_e0 [4];
  uint32_t clip_array_mbr_idx;
  string flatten_from_ib_mbr_name;
  undefined1 local_b8 [7];
  bool flatten_from_ib_var;
  ID local_94;
  SPIRType *local_90;
  SPIRType *usable_type;
  uint32_t local_80;
  bool is_sample;
  uint32_t local_78;
  bool is_centroid;
  uint32_t local_70;
  bool is_noperspective;
  uint32_t local_68;
  uint32_t uStack_64;
  bool is_flat;
  byte local_5d;
  BuiltIn builtin;
  bool is_builtin;
  uint32_t local_4c;
  SPIRType *pSStack_48;
  uint32_t elem_cnt;
  SPIRType *var_type;
  SPIRFunction *entry_func;
  InterfaceBlockMeta *meta_local;
  SPIRVariable *var_local;
  SPIRType *ib_type_local;
  string *ib_var_ref_local;
  CompilerMSL *pCStack_10;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  entry_func = (SPIRFunction *)meta;
  meta_local = (InterfaceBlockMeta *)var;
  var_local = (SPIRVariable *)ib_type;
  ib_type_local = (SPIRType *)ib_var_ref;
  ib_var_ref_local._4_4_ = storage;
  pCStack_10 = this;
  uVar3 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  var_type = (SPIRType *)Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar3);
  if (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0) {
    local_390 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)meta_local);
  }
  else {
    local_390 = Compiler::get_variable_element_type((Compiler *)this,(SPIRVariable *)meta_local);
  }
  pSStack_48 = local_390;
  local_4c = 0;
  bVar1 = add_component_variable_to_interface_block
                    (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRVariable *)meta_local,
                     local_390,(InterfaceBlockMeta *)entry_func);
  if (bVar1) {
    return;
  }
  bVar1 = Compiler::is_matrix((Compiler *)this,pSStack_48);
  if (bVar1) {
    bVar1 = Compiler::is_array((Compiler *)this,pSStack_48);
    if (bVar1) {
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"MSL cannot emit arrays-of-matrices in input and output variables.");
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_4c = pSStack_48->columns;
  }
  else {
    bVar1 = Compiler::is_array((Compiler *)this,pSStack_48);
    if (bVar1) {
      sVar5 = VectorView<unsigned_int>::size(&(pSStack_48->array).super_VectorView<unsigned_int>);
      if (sVar5 != 1) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar4,"MSL cannot emit arrays-of-arrays in input and output variables.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_4c = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSStack_48);
    }
  }
  local_5d = Compiler::is_builtin_variable((Compiler *)this,(SPIRVariable *)meta_local);
  local_68 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  uStack_64 = Compiler::get_decoration((Compiler *)this,(ID)local_68,BuiltIn);
  local_70 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  is_noperspective = Compiler::has_decoration((Compiler *)this,(ID)local_70,DecorationFlat);
  local_78 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  is_centroid = Compiler::has_decoration((Compiler *)this,(ID)local_78,DecorationNoPerspective);
  local_80 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  is_sample = Compiler::has_decoration((Compiler *)this,(ID)local_80,Centroid);
  usable_type._0_4_ = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  usable_type._7_1_ = Compiler::has_decoration((Compiler *)this,usable_type._0_4_,DecorationSample);
  local_90 = pSStack_48;
  if ((pSStack_48->pointer & 1U) != 0) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_48->parent_type);
    local_90 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
  }
  while( true ) {
    bVar1 = Compiler::is_array((Compiler *)this,local_90);
    local_3a1 = true;
    if (!bVar1) {
      local_3a1 = Compiler::is_matrix((Compiler *)this,local_90);
    }
    if (local_3a1 == false) break;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_90->parent_type);
    local_90 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
  }
  if ((local_5d & 1) != 0) {
    local_94.id = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              ((string *)local_b8,this,(ulong)uStack_64,7);
    Compiler::set_name((Compiler *)this,local_94,(string *)local_b8);
    ::std::__cxx11::string::~string((string *)local_b8);
  }
  flatten_from_ib_mbr_name.field_2._M_local_buf[0xf] = '\0';
  ::std::__cxx11::string::string((string *)local_e0);
  pSVar13 = var_type;
  if (((ib_var_ref_local._4_4_ == Output) && ((local_5d & 1) != 0)) && (uStack_64 == 3)) {
    sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                       &var_local->deferred_declaration);
    local_e4 = (uint32_t)sVar5;
    pbVar6 = &var_local->deferred_declaration;
    uVar3 = Compiler::get_variable_data_type_id((Compiler *)this,(SPIRVariable *)meta_local);
    TypedID<(spirv_cross::Types)1>::TypedID(&local_e8,uVar3);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)pbVar6,&local_e8);
    local_ec = (uint32_t)
               TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    local_390 = (SPIRType *)0x3;
    Compiler::set_member_decoration((Compiler *)this,(TypeID)local_ec,local_e4,BuiltIn,3);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_110,this,3);
    ::std::__cxx11::string::operator=((string *)local_e0,local_110);
    ::std::__cxx11::string::~string(local_110);
    local_114 = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_name((Compiler *)this,(TypeID)local_114,local_e4,(string *)local_e0);
    flatten_from_ib_mbr_name.field_2._M_local_buf[0xf] = '\x01';
    if (((this->msl_options).enable_clip_distance_user_varying & 1U) == 0) {
      local_118 = 1;
      goto LAB_0034ca9d;
    }
  }
  else if (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0) {
    i = (uint32_t)
        TypedID::operator_cast_to_TypedID
                  ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
    SPIRFunction::add_local_variable((SPIRFunction *)pSVar13,(VariableID)i);
    ib_mbr_idx = TypedID::operator_cast_to_unsigned_int
                           ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
    SmallVector<unsigned_int,_8UL>::push_back(&this->vars_needing_early_declaration,&ib_mbr_idx);
  }
  for (target_components = 0; target_components < local_4c;
      target_components = target_components + 1) {
    sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                       &var_local->deferred_declaration);
    uStack_128 = (uint32_t)sVar5;
    type_id = 0;
    local_12d = 0;
    locn = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_90->super_IVariant).self);
    local_138 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
    pBVar7 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_138);
    bVar1 = Bitset::get(pBVar7,0x1e);
    if (((bVar1) && (((this->msl_options).pad_fragment_output_components & 1U) != 0)) &&
       ((pSVar8 = Compiler::get_entry_point((Compiler *)this),
        pSVar8->model == ExecutionModelFragment && (ib_var_ref_local._4_4_ == Output)))) {
      local_140 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      local_13c = Compiler::get_decoration((Compiler *)this,(ID)local_140,DecorationLocation);
      local_13c = local_13c + target_components;
      type_id = get_target_components_for_fragment_location(this,local_13c);
      if (local_90->vecsize < type_id) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_90->super_IVariant).self);
        locn = build_extended_vector_type(this,uVar3,type_id,Unknown);
        local_12d = 1;
      }
    }
    bVar1 = false;
    if (ib_var_ref_local._4_4_ == Input) {
      local_144 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
      sVar9 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&this->pull_model_inputs,&local_144);
      bVar1 = sVar9 != 0;
    }
    if (bVar1) {
      pbVar6 = &var_local->deferred_declaration;
      uVar3 = Compiler::get_pointee_type_id((Compiler *)this,locn);
      uVar3 = build_msl_interpolant_type(this,uVar3,(bool)(is_centroid & 1));
      TypedID<(spirv_cross::Types)1>::TypedID(&local_148,uVar3);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)pbVar6,&local_148)
      ;
    }
    else {
      pbVar6 = &var_local->deferred_declaration;
      uVar3 = Compiler::get_pointee_type_id((Compiler *)this,locn);
      TypedID<(spirv_cross::Types)1>::TypedID
                ((TypedID<(spirv_cross::Types)1> *)((long)&mbr_name.field_2 + 0xc),uVar3);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)pbVar6,
                 (TypedID<(spirv_cross::Types)1> *)((long)&mbr_name.field_2 + 0xc));
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
    CompilerGLSL::to_expression_abi_cxx11_(&local_1b0,&this->super_CompilerGLSL,uVar3,true);
    join<std::__cxx11::string,char_const(&)[2],unsigned_int&>
              (&local_190,(spirv_cross *)&local_1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x597e50,
               (char (*) [2])&target_components,(uint *)local_390);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1d0,"m",&local_1d1);
    ensure_valid_name((string *)local_170,this,&local_190,&local_1d0);
    ::std::__cxx11::string::~string((string *)&local_1d0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    ::std::__cxx11::string::~string((string *)&local_190);
    ::std::__cxx11::string::~string((string *)&local_1b0);
    locn_1 = (uint32_t)
             TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_name((Compiler *)this,(TypeID)locn_1,uStack_128,(string *)local_170);
    local_1dc = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
    pBVar7 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_1dc);
    bVar1 = Bitset::get(pBVar7,0x1e);
    if (bVar1) {
      local_1e4 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      uVar3 = Compiler::get_decoration((Compiler *)this,(ID)local_1e4,DecorationLocation);
      comp = uVar3 + target_components;
      mbr_type_id = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      local_1e8 = Compiler::get_decoration((Compiler *)this,(ID)mbr_type_id,Component);
      if (ib_var_ref_local._4_4_ == Input) {
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((long)&(meta_local->location_meta)._M_h._M_bucket_count + 4))
        ;
        uVar3 = ensure_correct_input_type
                          (this,uVar3,comp,local_1e8,0,
                           (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1));
        TypedID<(spirv_cross::Types)1>::TypedID(&local_1f0,uVar3);
        *(uint32_t *)((long)&(meta_local->location_meta)._M_h._M_bucket_count + 4) = local_1f0.id;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_90->super_IVariant).self);
        local_1f4 = ensure_correct_input_type
                              (this,uVar3,comp,local_1e8,0,
                               (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1));
        bVar1 = false;
        if (ib_var_ref_local._4_4_ == Input) {
          local_1f8 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
          sVar9 = ::std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::count(&this->pull_model_inputs,&local_1f8);
          bVar1 = sVar9 != 0;
        }
        if (bVar1) {
          uVar3 = build_msl_interpolant_type(this,local_1f4,(bool)(is_centroid & 1));
          TypedID<(spirv_cross::Types)1>::TypedID(&local_1fc,uVar3);
          pTVar10 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                               &var_local->deferred_declaration,(ulong)uStack_128);
          pTVar10->id = local_1fc.id;
        }
        else {
          TypedID<(spirv_cross::Types)1>::TypedID(&local_200,local_1f4);
          pTVar10 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                               &var_local->deferred_declaration,(ulong)uStack_128);
          pTVar10->id = local_200.id;
        }
      }
      local_204 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)local_204,uStack_128,DecorationLocation,comp);
      if (local_1e8 != 0) {
        locn_2 = (uint32_t)
                 TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)locn_2,uStack_128,Component,local_1e8);
      }
      mark_location_as_used_by_shader(this,comp,local_90,ib_var_ref_local._4_4_,false);
    }
    else {
      bVar1 = false;
      if ((local_5d & 1) != 0) {
        bVar2 = Compiler::is_tessellation_shader((Compiler *)this);
        bVar1 = false;
        if ((bVar2) && (bVar1 = false, ib_var_ref_local._4_4_ == Input)) {
          local_20c = uStack_64;
          sVar11 = ::std::
                   unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                   ::count(&this->inputs_by_builtin,&local_20c);
          bVar1 = sVar11 != 0;
        }
      }
      if (bVar1) {
        local_214 = uStack_64;
        pmVar12 = ::std::
                  unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                  ::operator[](&this->inputs_by_builtin,&local_214);
        local_210 = pmVar12->location + target_components;
        locn_3 = (uint32_t)
                 TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)locn_3,uStack_128,DecorationLocation,local_210);
        mark_location_as_used_by_shader(this,local_210,local_90,ib_var_ref_local._4_4_,false);
      }
      else {
        bVar1 = false;
        if ((((local_5d & 1) != 0) && (bVar1 = false, (this->capture_output_to_buffer & 1U) != 0))
           && (bVar1 = false, ib_var_ref_local._4_4_ == Output)) {
          local_21c = uStack_64;
          sVar11 = ::std::
                   unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                   ::count(&this->outputs_by_builtin,&local_21c);
          bVar1 = sVar11 != 0;
        }
        if (bVar1) {
          local_224 = uStack_64;
          pmVar12 = ::std::
                    unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                    ::operator[](&this->outputs_by_builtin,&local_224);
          local_220 = pmVar12->location + target_components;
          local_228 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(var_local->super_IVariant).self);
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)local_228,uStack_128,DecorationLocation,local_220);
          mark_location_as_used_by_shader(this,local_220,local_90,ib_var_ref_local._4_4_,false);
        }
        else if (((local_5d & 1) != 0) && ((uStack_64 == 3 || (uStack_64 == 4)))) {
          local_22c = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(var_local->super_IVariant).self);
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)local_22c,uStack_128,BuiltIn,uStack_64);
          index = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)index,uStack_128,DecorationIndex,target_components);
        }
      }
    }
    local_234 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
    pBVar7 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_234);
    bVar1 = Bitset::get(pBVar7,0x20);
    if (bVar1) {
      local_23c = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      local_238 = Compiler::get_decoration((Compiler *)this,(ID)local_23c,DecorationIndex);
      local_240 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)local_240,uStack_128,DecorationIndex,local_238);
    }
    bVar1 = true;
    if (ib_var_ref_local._4_4_ == Input) {
      local_244 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
      sVar9 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&this->pull_model_inputs,&local_244);
      bVar1 = sVar9 == 0;
    }
    if (bVar1) {
      if ((is_noperspective & 1U) != 0) {
        local_248 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)local_248,uStack_128,DecorationFlat,0);
      }
      if ((is_centroid & 1U) != 0) {
        local_24c = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)local_24c,uStack_128,DecorationNoPerspective,0);
      }
      if ((is_sample & 1U) != 0) {
        local_250 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration((Compiler *)this,(TypeID)local_250,uStack_128,Centroid,0);
      }
      if ((usable_type._7_1_ & 1) != 0) {
        local_254 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)local_254,uStack_128,DecorationSample,0);
      }
    }
    type = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_local->super_IVariant).self);
    uVar3 = uStack_128;
    value = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
    local_390 = (SPIRType *)(ulong)value;
    Compiler::set_extended_member_decoration
              ((Compiler *)this,type,uVar3,SPIRVCrossDecorationInterfaceOrigID,value);
    if (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0) {
      if (ib_var_ref_local._4_4_ == Input) {
        pSVar13 = var_type + 2;
        local_2d0.var = (SPIRVariable *)meta_local;
        local_2d0.is_centroid = (bool)(is_sample & 1);
        local_2d0.is_sample = (bool)(usable_type._7_1_ & 1);
        local_2d0.i = target_components;
        local_2d0.this = this;
        ::std::__cxx11::string::string((string *)&local_2d0.ib_var_ref,(string *)ib_type_local);
        ::std::__cxx11::string::string((string *)&local_2d0.mbr_name,(string *)local_170);
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::add_composite_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)::__0,void>
                  ((function<void()> *)&local_278,&local_2d0);
        SmallVector<std::function<void_()>,_0UL>::push_back
                  ((SmallVector<std::function<void_()>,_0UL> *)pSVar13,&local_278);
        ::std::function<void_()>::~function(&local_278);
        add_composite_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
        ::$_0::~__0((__0 *)&local_2d0);
      }
      else if (ib_var_ref_local._4_4_ == Output) {
        pSVar13 = var_type + 1;
        local_380.var = (SPIRVariable *)meta_local;
        local_380.padded_output = (bool)(local_12d & 1);
        local_380.type_id = locn;
        local_380.this = this;
        ::std::__cxx11::string::string((string *)&local_380.ib_var_ref,(string *)ib_type_local);
        ::std::__cxx11::string::string((string *)&local_380.mbr_name,(string *)local_170);
        local_380.usable_type = local_90;
        local_380.i = target_components;
        local_380.flatten_from_ib_var =
             (bool)(flatten_from_ib_mbr_name.field_2._M_local_buf[0xf] & 1);
        ::std::__cxx11::string::string
                  ((string *)&local_380.flatten_from_ib_mbr_name,(string *)local_e0);
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::add_composite_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)::__1,void>
                  ((function<void()> *)&local_2f0,&local_380);
        SmallVector<std::function<void_()>,_0UL>::push_back
                  ((SmallVector<std::function<void_()>,_0UL> *)
                   &(pSVar13->member_name_cache)._M_h._M_element_count,&local_2f0);
        ::std::function<void_()>::~function(&local_2f0);
        add_composite_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
        ::$_1::~__1((__1 *)&local_380);
      }
    }
    ::std::__cxx11::string::~string((string *)local_170);
  }
  local_118 = 0;
LAB_0034ca9d:
  ::std::__cxx11::string::~string((string *)local_e0);
  return;
}

Assistant:

void CompilerMSL::add_composite_variable_to_interface_block(StorageClass storage, const string &ib_var_ref,
                                                            SPIRType &ib_type, SPIRVariable &var,
                                                            InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	uint32_t elem_cnt = 0;

	if (add_component_variable_to_interface_block(storage, ib_var_ref, var, var_type, meta))
		return;

	if (is_matrix(var_type))
	{
		if (is_array(var_type))
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

		elem_cnt = var_type.columns;
	}
	else if (is_array(var_type))
	{
		if (var_type.array.size() != 1)
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

		elem_cnt = to_array_size_literal(var_type);
	}

	bool is_builtin = is_builtin_variable(var);
	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_flat = has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_decoration(var.self, DecorationCentroid);
	bool is_sample = has_decoration(var.self, DecorationSample);

	auto *usable_type = &var_type;
	if (usable_type->pointer)
		usable_type = &get<SPIRType>(usable_type->parent_type);
	while (is_array(*usable_type) || is_matrix(*usable_type))
		usable_type = &get<SPIRType>(usable_type->parent_type);

	// If a builtin, force it to have the proper name.
	if (is_builtin)
		set_name(var.self, builtin_to_glsl(builtin, StorageClassFunction));

	bool flatten_from_ib_var = false;
	string flatten_from_ib_mbr_name;

	if (storage == StorageClassOutput && is_builtin && builtin == BuiltInClipDistance)
	{
		// Also declare [[clip_distance]] attribute here.
		uint32_t clip_array_mbr_idx = uint32_t(ib_type.member_types.size());
		ib_type.member_types.push_back(get_variable_data_type_id(var));
		set_member_decoration(ib_type.self, clip_array_mbr_idx, DecorationBuiltIn, BuiltInClipDistance);

		flatten_from_ib_mbr_name = builtin_to_glsl(BuiltInClipDistance, StorageClassOutput);
		set_member_name(ib_type.self, clip_array_mbr_idx, flatten_from_ib_mbr_name);

		// When we flatten, we flatten directly from the "out" struct,
		// not from a function variable.
		flatten_from_ib_var = true;

		if (!msl_options.enable_clip_distance_user_varying)
			return;
	}
	else if (!meta.strip_array)
	{
		// Only flatten/unflatten IO composites for non-tessellation cases where arrays are not stripped.
		entry_func.add_local_variable(var.self);
		// We need to declare the variable early and at entry-point scope.
		vars_needing_early_declaration.push_back(var.self);
	}

	for (uint32_t i = 0; i < elem_cnt; i++)
	{
		// Add a reference to the variable type to the interface struct.
		uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

		uint32_t target_components = 0;
		bool padded_output = false;
		uint32_t type_id = usable_type->self;

		// Check if we need to pad fragment output to match a certain number of components.
		if (get_decoration_bitset(var.self).get(DecorationLocation) && msl_options.pad_fragment_output_components &&
		    get_entry_point().model == ExecutionModelFragment && storage == StorageClassOutput)
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation) + i;
			target_components = get_target_components_for_fragment_location(locn);
			if (usable_type->vecsize < target_components)
			{
				// Make a new type here.
				type_id = build_extended_vector_type(usable_type->self, target_components);
				padded_output = true;
			}
		}

		if (storage == StorageClassInput && pull_model_inputs.count(var.self))
			ib_type.member_types.push_back(build_msl_interpolant_type(get_pointee_type_id(type_id), is_noperspective));
		else
			ib_type.member_types.push_back(get_pointee_type_id(type_id));

		// Give the member a name
		string mbr_name = ensure_valid_name(join(to_expression(var.self), "_", i), "m");
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

		// There is no qualified alias since we need to flatten the internal array on return.
		if (get_decoration_bitset(var.self).get(DecorationLocation))
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation) + i;
			uint32_t comp = get_decoration(var.self, DecorationComponent);
			if (storage == StorageClassInput)
			{
				var.basetype = ensure_correct_input_type(var.basetype, locn, comp, 0, meta.strip_array);
				uint32_t mbr_type_id = ensure_correct_input_type(usable_type->self, locn, comp, 0, meta.strip_array);
				if (storage == StorageClassInput && pull_model_inputs.count(var.self))
					ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(mbr_type_id, is_noperspective);
				else
					ib_type.member_types[ib_mbr_idx] = mbr_type_id;
			}
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			if (comp)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, comp);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
		{
			uint32_t locn = inputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
		{
			uint32_t locn = outputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance))
		{
			// Declare the Clip/CullDistance as [[user(clip/cullN)]].
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, i);
		}

		if (get_decoration_bitset(var.self).get(DecorationIndex))
		{
			uint32_t index = get_decoration(var.self, DecorationIndex);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, index);
		}

		if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
		{
			// Copy interpolation decorations if needed
			if (is_flat)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
			if (is_noperspective)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
			if (is_centroid)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
			if (is_sample)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
		}

		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);

		// Only flatten/unflatten IO composites for non-tessellation cases where arrays are not stripped.
		if (!meta.strip_array)
		{
			switch (storage)
			{
			case StorageClassInput:
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					if (pull_model_inputs.count(var.self))
					{
						string lerp_call;
						if (is_centroid)
							lerp_call = ".interpolate_at_centroid()";
						else if (is_sample)
							lerp_call = join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
						else
							lerp_call = ".interpolate_at_center()";
						statement(to_name(var.self), "[", i, "] = ", ib_var_ref, ".", mbr_name, lerp_call, ";");
					}
					else
					{
						statement(to_name(var.self), "[", i, "] = ", ib_var_ref, ".", mbr_name, ";");
					}
				});
				break;

			case StorageClassOutput:
				entry_func.fixup_hooks_out.push_back([=, &var]() {
					if (padded_output)
					{
						auto &padded_type = this->get<SPIRType>(type_id);
						statement(
						    ib_var_ref, ".", mbr_name, " = ",
						    remap_swizzle(padded_type, usable_type->vecsize, join(to_name(var.self), "[", i, "]")),
						    ";");
					}
					else if (flatten_from_ib_var)
						statement(ib_var_ref, ".", mbr_name, " = ", ib_var_ref, ".", flatten_from_ib_mbr_name, "[", i,
						          "];");
					else
						statement(ib_var_ref, ".", mbr_name, " = ", to_name(var.self), "[", i, "];");
				});
				break;

			default:
				break;
			}
		}
	}
}